

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filetree.c
# Opt level: O3

void get_shortest_string(gpointer user,gpointer user_data)

{
  char *__s;
  size_t sVar1;
  
  __s = *(char **)(*user + 8);
  sVar1 = strlen(__s);
  if (sVar1 < *(ulong *)((long)user_data + 8)) {
    *(char **)user_data = __s;
    *(size_t *)((long)user_data + 8) = sVar1;
  }
  return;
}

Assistant:

static void get_shortest_string(gpointer user, gpointer user_data)
{
    struct filename_list_node *fln = (struct filename_list_node *) user;
    struct string_plus_length *spl = (struct string_plus_length *) user_data;
    size_t display_string_length = strlen(fln->fr->display);

    if (display_string_length < spl->length) {
        spl->string = fln->fr->display;
        spl->length = display_string_length;
    }
}